

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

PrimMeta * __thiscall tinyusdz::Prim::metas(Prim *this)

{
  Model *pMVar1;
  Scope *pSVar2;
  Xform *pXVar3;
  GeomMesh *pGVar4;
  GPrim *pGVar5;
  GeomPoints *pGVar6;
  GeomCube *pGVar7;
  GeomCapsule *pGVar8;
  GeomCylinder *pGVar9;
  GeomSphere *pGVar10;
  GeomCone *pGVar11;
  PrimMeta *pPVar12;
  GeomSubset *pGVar13;
  GeomCamera *pGVar14;
  GeomBasisCurves *pGVar15;
  DomeLight *pDVar16;
  SphereLight *pSVar17;
  RectLight *pRVar18;
  CylinderLight *pCVar19;
  DiskLight *pDVar20;
  Material *pMVar21;
  Shader *pSVar22;
  SkelRoot *pSVar23;
  Skeleton *pSVar24;
  SkelAnimation *pSVar25;
  BlendShape *pBVar26;
  Value *this_00;
  
  this_00 = &this->_data;
  pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(this_00,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(this_00,false);
    if (pSVar2 == (Scope *)0x0) {
      pXVar3 = tinyusdz::value::Value::as<tinyusdz::Xform>(this_00,false);
      if (pXVar3 == (Xform *)0x0) {
        pGVar5 = tinyusdz::value::Value::as<tinyusdz::GPrim>(this_00,false);
        if (pGVar5 == (GPrim *)0x0) {
          pGVar4 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this_00,false);
          if (pGVar4 == (GeomMesh *)0x0) {
            pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this_00,false);
            if (pGVar6 == (GeomPoints *)0x0) {
              pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomCube>(this_00,false);
              if (pGVar7 == (GeomCube *)0x0) {
                pGVar8 = tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this_00,false);
                if (pGVar8 == (GeomCapsule *)0x0) {
                  pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this_00,false);
                  if (pGVar9 == (GeomCylinder *)0x0) {
                    pGVar10 = tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this_00,false);
                    if (pGVar10 == (GeomSphere *)0x0) {
                      pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomCone>(this_00,false);
                      if (pGVar11 == (GeomCone *)0x0) {
                        pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(this_00,false);
                        if (pGVar13 != (GeomSubset *)0x0) {
                          pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(this_00,false);
                          pPVar12 = &pGVar13->meta;
                          goto LAB_0029220d;
                        }
                        pGVar14 = tinyusdz::value::Value::as<tinyusdz::GeomCamera>(this_00,false);
                        if (pGVar14 == (GeomCamera *)0x0) {
                          pGVar15 = tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>
                                              (this_00,false);
                          if (pGVar15 == (GeomBasisCurves *)0x0) {
                            pDVar16 = tinyusdz::value::Value::as<tinyusdz::DomeLight>(this_00,false)
                            ;
                            if (pDVar16 == (DomeLight *)0x0) {
                              pSVar17 = tinyusdz::value::Value::as<tinyusdz::SphereLight>
                                                  (this_00,false);
                              if (pSVar17 == (SphereLight *)0x0) {
                                pCVar19 = tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                    (this_00,false);
                                if (pCVar19 == (CylinderLight *)0x0) {
                                  pDVar20 = tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                      (this_00,false);
                                  if (pDVar20 == (DiskLight *)0x0) {
                                    pRVar18 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                        (this_00,false);
                                    if (pRVar18 == (RectLight *)0x0) {
                                      pMVar21 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                          (this_00,false);
                                      if (pMVar21 == (Material *)0x0) {
                                        pSVar22 = tinyusdz::value::Value::as<tinyusdz::Shader>
                                                            (this_00,false);
                                        if (pSVar22 == (Shader *)0x0) {
                                          pSVar23 = tinyusdz::value::Value::as<tinyusdz::SkelRoot>
                                                              (this_00,false);
                                          if (pSVar23 == (SkelRoot *)0x0) {
                                            pSVar24 = tinyusdz::value::Value::as<tinyusdz::Skeleton>
                                                                (this_00,false);
                                            if (pSVar24 == (Skeleton *)0x0) {
                                              pSVar25 = tinyusdz::value::Value::
                                                        as<tinyusdz::SkelAnimation>(this_00,false);
                                              if (pSVar25 == (SkelAnimation *)0x0) {
                                                pPVar12 = (PrimMeta *)0x0;
                                                pBVar26 = tinyusdz::value::Value::
                                                          as<tinyusdz::BlendShape>(this_00,false);
                                                if (pBVar26 != (BlendShape *)0x0) {
                                                  pBVar26 = tinyusdz::value::Value::
                                                            as<tinyusdz::BlendShape>(this_00,false);
                                                  pPVar12 = &pBVar26->meta;
                                                }
                                              }
                                              else {
                                                pSVar25 = tinyusdz::value::Value::
                                                          as<tinyusdz::SkelAnimation>(this_00,false)
                                                ;
                                                pPVar12 = &pSVar25->meta;
                                              }
                                            }
                                            else {
                                              pSVar24 = tinyusdz::value::Value::
                                                        as<tinyusdz::Skeleton>(this_00,false);
                                              pPVar12 = &pSVar24->meta;
                                            }
                                          }
                                          else {
                                            pSVar23 = tinyusdz::value::Value::as<tinyusdz::SkelRoot>
                                                                (this_00,false);
                                            pPVar12 = &pSVar23->meta;
                                          }
                                          goto LAB_0029220d;
                                        }
                                        pMVar21 = (Material *)
                                                  tinyusdz::value::Value::as<tinyusdz::Shader>
                                                            (this_00,false);
                                      }
                                      else {
                                        pMVar21 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                            (this_00,false);
                                      }
                                      pPVar12 = &(pMVar21->super_UsdShadePrim).meta;
                                      goto LAB_0029220d;
                                    }
                                    pRVar18 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                        (this_00,false);
                                  }
                                  else {
                                    pRVar18 = (RectLight *)
                                              tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                        (this_00,false);
                                  }
                                }
                                else {
                                  pRVar18 = (RectLight *)
                                            tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                      (this_00,false);
                                }
                              }
                              else {
                                pRVar18 = (RectLight *)
                                          tinyusdz::value::Value::as<tinyusdz::SphereLight>
                                                    (this_00,false);
                              }
                              pPVar12 = &(pRVar18->super_BoundableLight).meta;
                            }
                            else {
                              pDVar16 = tinyusdz::value::Value::as<tinyusdz::DomeLight>
                                                  (this_00,false);
                              pPVar12 = &(pDVar16->super_NonboundableLight).meta;
                            }
                            goto LAB_0029220d;
                          }
                          pGVar4 = (GeomMesh *)
                                   tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>
                                             (this_00,false);
                        }
                        else {
                          pGVar4 = (GeomMesh *)
                                   tinyusdz::value::Value::as<tinyusdz::GeomCamera>(this_00,false);
                        }
                      }
                      else {
                        pGVar4 = (GeomMesh *)
                                 tinyusdz::value::Value::as<tinyusdz::GeomCone>(this_00,false);
                      }
                    }
                    else {
                      pGVar4 = (GeomMesh *)
                               tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this_00,false);
                    }
                  }
                  else {
                    pGVar4 = (GeomMesh *)
                             tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this_00,false);
                  }
                }
                else {
                  pGVar4 = (GeomMesh *)
                           tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this_00,false);
                }
              }
              else {
                pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomCube>(this_00,false);
              }
            }
            else {
              pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this_00,false);
            }
          }
          else {
            pGVar4 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this_00,false);
          }
        }
        else {
          pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GPrim>(this_00,false);
        }
      }
      else {
        pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::Xform>(this_00,false);
      }
      pPVar12 = &(pGVar4->super_GPrim).meta;
    }
    else {
      pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(this_00,false);
      pPVar12 = &pSVar2->meta;
    }
  }
  else {
    pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(this_00,false);
    pPVar12 = &pMVar1->meta;
  }
LAB_0029220d:
  if (pPVar12 != (PrimMeta *)0x0) {
    return pPVar12;
  }
  pPVar12 = EmptyStaticMeta::GetEmptyStaticMeta();
  return pPVar12;
}

Assistant:

PrimMeta &Prim::metas() {
  PrimMeta *p = GetPrimMeta(_data);
  if (p) {
    return *p;
  }

  // TODO: This should not happen. report an error.
  return EmptyStaticMeta::GetEmptyStaticMeta();
}